

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O0

void __thiscall
fill<16U,_15U,_buffer_layout_bfs>::operator()
          (fill<16U,_15U,_buffer_layout_bfs> *this,array<Stream,_16UL> *streams,uchar **buffer,
          array<unsigned_long,_16UL> *buffer_count)

{
  size_t sVar1;
  uchar **ppuVar2;
  uchar *puVar3;
  uchar **ppuVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  ostream *poVar8;
  reference pvVar9;
  reference pvVar10;
  long lVar11;
  array<unsigned_long,_16UL> *buffer_count_local;
  uchar **buffer_local;
  array<Stream,_16UL> *streams_local;
  fill<16U,_15U,_buffer_layout_bfs> *this_local;
  long local_50;
  size_t n_1;
  long local_38;
  size_t n;
  size_t empty;
  DI __d;
  
  __d.i = (string *)buffer_count;
  poVar8 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
  poVar8 = std::operator<<(poVar8,"fill_leaf");
  poVar8 = std::operator<<(poVar8,", leaf,  I=");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xf);
  std::operator<<(poVar8,"\n");
  fill_leaf<16u,15u,buffer_layout_bfs>(std::array<Stream,16u>&,unsigned_char**,std::
  array<unsigned_long,16u>&,std::integral_constant<bool,true>)::DI::DI(std::__cxx11::string__
            (&empty,(string *)__debug_indent_str_abi_cxx11_);
  pvVar9 = std::array<unsigned_long,_16UL>::operator[]((array<unsigned_long,_16UL> *)__d.i,0xf);
  if (*pvVar9 != 0) {
    __assert_fail("buffer_count[I] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                  ,0x13b,
                  "void fill_leaf(std::array<Stream, K> &__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict, std::true_type) [K = 16U, I = 15U, BufferLayout = buffer_layout_bfs]"
                 );
  }
  pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xe);
  sVar1 = pvVar10->n;
  pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xf);
  if (sVar1 + pvVar10->n < 8) {
    pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xe);
    sVar1 = pvVar10->n;
    pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xf);
    lVar5 = -(sVar1 + pvVar10->n);
    lVar11 = lVar5 + 8;
    local_38 = 8;
    poVar8 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
    poVar8 = std::operator<<(poVar8,"need=");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,8);
    poVar8 = std::operator<<(poVar8,", Ln=");
    pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xe);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,pvVar10->n);
    poVar8 = std::operator<<(poVar8,", Rn=");
    pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xf);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,pvVar10->n);
    std::operator<<(poVar8,"\n");
    pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xe);
    lVar6 = local_38;
    if (pvVar10->n == 0) {
LAB_00161960:
      local_38 = lVar6;
      poVar8 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
      poVar8 = std::operator<<(poVar8,"left drained, Ln=");
      pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xe);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,pvVar10->n);
      poVar8 = std::operator<<(poVar8,", Rn=");
      pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xf);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,pvVar10->n);
      std::operator<<(poVar8,"\n");
      pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xf);
      ppuVar4 = pvVar10->stream;
      pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xf);
      ppuVar2 = pvVar10->stream;
      pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xf);
      std::copy<unsigned_char**,unsigned_char**>
                (ppuVar4,ppuVar2 + pvVar10->n,buffer + lVar11 + (0x150 - local_38));
      pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xf);
      pvVar10->n = 0;
      pvVar9 = std::array<unsigned_long,_16UL>::operator[]((array<unsigned_long,_16UL> *)__d.i,0xf);
      *pvVar9 = 8 - lVar11;
    }
    else {
      pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xf);
      if (pvVar10->n != 0) {
        do {
          pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xe);
          puVar3 = *pvVar10->stream;
          pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xf);
          iVar7 = cmp(puVar3,*pvVar10->stream);
          if (iVar7 < 1) {
            pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xe);
            buffer[lVar11 + (0x150 - local_38)] = *pvVar10->stream;
            pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xe);
            pvVar10->stream = pvVar10->stream + 1;
            pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xe);
            pvVar10->n = pvVar10->n - 1;
            pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xe);
            lVar6 = local_38 + -1;
            if (pvVar10->n == 0) goto LAB_00161960;
          }
          else {
            pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xf);
            buffer[lVar11 + (0x150 - local_38)] = *pvVar10->stream;
            pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xf);
            pvVar10->stream = pvVar10->stream + 1;
            pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xf);
            pvVar10->n = pvVar10->n - 1;
            pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xf);
            lVar6 = local_38 + -1;
            if (pvVar10->n == 0) break;
          }
          local_38 = local_38 + -1;
        } while( true );
      }
      local_38 = lVar6;
      poVar8 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
      poVar8 = std::operator<<(poVar8,"right drained, Ln=");
      pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xe);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,pvVar10->n);
      poVar8 = std::operator<<(poVar8,", Rn=");
      pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xf);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,pvVar10->n);
      std::operator<<(poVar8,"\n");
      pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xe);
      ppuVar4 = pvVar10->stream;
      pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xe);
      ppuVar2 = pvVar10->stream;
      pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xe);
      std::copy<unsigned_char**,unsigned_char**>
                (ppuVar4,ppuVar2 + pvVar10->n,buffer + lVar11 + (0x150 - local_38));
      pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xe);
      pvVar10->n = 0;
      pvVar9 = std::array<unsigned_long,_16UL>::operator[]((array<unsigned_long,_16UL> *)__d.i,0xf);
      *pvVar9 = 8 - lVar11;
      check_input(buffer + lVar5 + 0x150,8 - lVar11);
    }
  }
  else {
    local_50 = 8;
    poVar8 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
    poVar8 = std::operator<<(poVar8,"need=");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,8);
    poVar8 = std::operator<<(poVar8,", Ln=");
    pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xe);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,pvVar10->n);
    poVar8 = std::operator<<(poVar8,", Rn=");
    pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xf);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,pvVar10->n);
    std::operator<<(poVar8,"\n");
    pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xe);
    lVar5 = local_50;
    if (pvVar10->n == 0) {
LAB_00161f5a:
      local_50 = lVar5;
      poVar8 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
      poVar8 = std::operator<<(poVar8,"left drained, Ln=");
      pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xe);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,pvVar10->n);
      poVar8 = std::operator<<(poVar8,", Rn=");
      pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xf);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,pvVar10->n);
      std::operator<<(poVar8,"\n");
      pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xf);
      ppuVar4 = pvVar10->stream;
      pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xf);
      std::copy<unsigned_char**,unsigned_char**>
                (ppuVar4,pvVar10->stream + local_50,buffer + (0x150 - local_50));
      pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xf);
      pvVar10->n = pvVar10->n - local_50;
      pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xf);
      pvVar10->stream = pvVar10->stream + local_50;
      pvVar9 = std::array<unsigned_long,_16UL>::operator[]((array<unsigned_long,_16UL> *)__d.i,0xf);
      *pvVar9 = 8;
      check_input(buffer + 0x148,8);
    }
    else {
      pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xf);
      if (pvVar10->n == 0) {
LAB_00162103:
        local_50 = lVar5;
        poVar8 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
        poVar8 = std::operator<<(poVar8,"right drained, Ln=");
        pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xe);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,pvVar10->n);
        poVar8 = std::operator<<(poVar8,", Rn=");
        pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xf);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,pvVar10->n);
        std::operator<<(poVar8,"\n");
        pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xe);
        ppuVar4 = pvVar10->stream;
        pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xe);
        std::copy<unsigned_char**,unsigned_char**>
                  (ppuVar4,pvVar10->stream + local_50,buffer + (0x150 - local_50));
        pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xe);
        pvVar10->n = pvVar10->n - local_50;
        pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xe);
        pvVar10->stream = pvVar10->stream + local_50;
        pvVar9 = std::array<unsigned_long,_16UL>::operator[]
                           ((array<unsigned_long,_16UL> *)__d.i,0xf);
        *pvVar9 = 8;
        check_input(buffer + 0x148,8);
      }
      else {
        for (; local_50 != 0; local_50 = local_50 + -1) {
          pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xe);
          puVar3 = *pvVar10->stream;
          pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xf);
          iVar7 = cmp(puVar3,*pvVar10->stream);
          if (iVar7 < 1) {
            pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xe);
            buffer[0x150 - local_50] = *pvVar10->stream;
            pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xe);
            pvVar10->stream = pvVar10->stream + 1;
            pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xe);
            pvVar10->n = pvVar10->n - 1;
            pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xe);
            lVar5 = local_50 + -1;
            if (pvVar10->n == 0) goto LAB_00161f5a;
          }
          else {
            pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xf);
            buffer[0x150 - local_50] = *pvVar10->stream;
            pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xf);
            pvVar10->stream = pvVar10->stream + 1;
            pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xf);
            pvVar10->n = pvVar10->n - 1;
            pvVar10 = std::array<Stream,_16UL>::operator[](streams,0xf);
            lVar5 = local_50 + -1;
            if (pvVar10->n == 0) goto LAB_00162103;
          }
        }
        pvVar9 = std::array<unsigned_long,_16UL>::operator[]
                           ((array<unsigned_long,_16UL> *)__d.i,0xf);
        *pvVar9 = 8;
        check_input(buffer + 0x148,8);
      }
    }
  }
  anon_func::DI::~DI((DI *)&empty);
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}